

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wabtapi.cc
# Opt level: O0

Var write_commands(Context *ctx,Script *script)

{
  bool bVar1;
  Var obj;
  Var value;
  size_type sVar2;
  reference this;
  pointer base;
  char *cmdObj_00;
  ModuleCommand *pMVar3;
  ulong uVar4;
  ActionCommandBase<(wabt::CommandType)1> *pAVar5;
  RegisterCommand *pRVar6;
  char *pcVar7;
  AssertModuleCommand<(wabt::CommandType)3> *pAVar8;
  AssertModuleCommand<(wabt::CommandType)4> *pAVar9;
  AssertModuleCommand<(wabt::CommandType)5> *pAVar10;
  AssertModuleCommand<(wabt::CommandType)6> *pAVar11;
  pointer pSVar12;
  AssertReturnCommand *pAVar13;
  ActionCommandBase<(wabt::CommandType)8> *pAVar14;
  ActionCommandBase<(wabt::CommandType)9> *pAVar15;
  AssertTrapCommandBase<(wabt::CommandType)10> *pAVar16;
  AssertTrapCommandBase<(wabt::CommandType)11> *pAVar17;
  pointer pAVar18;
  int __c;
  AssertTrapCommandBase<(wabt::CommandType)11> *assert_exhaustion_command;
  AssertTrapCommandBase<(wabt::CommandType)10> *assert_trap_command;
  ActionCommandBase<(wabt::CommandType)9> *assert_return_arithmetic_nan_command;
  ActionCommandBase<(wabt::CommandType)8> *assert_return_canonical_nan_command;
  AssertReturnCommand *assert_return_command;
  AssertModuleCommand<(wabt::CommandType)6> *assert_uninstantiable_command;
  AssertModuleCommand<(wabt::CommandType)5> *assert_unlinkable_command;
  AssertModuleCommand<(wabt::CommandType)4> *assert_invalid_command;
  AssertModuleCommand<(wabt::CommandType)3> *assert_malformed_command;
  RegisterCommand *register_command;
  ActionPtr *action;
  Module *module;
  Var cmdObj;
  Command *command;
  Index i;
  Index last_module_index;
  Var commandsArr;
  Var resultObj;
  Script *script_local;
  Context *ctx_local;
  
  obj = (*ctx->chakra->spec->createObject)(ctx->chakra->user_data);
  value = (*ctx->chakra->spec->createArray)(ctx->chakra->user_data);
  set_property(ctx,obj,4,value,"Unable to set commands");
  command._4_4_ = 0xffffffff;
  command._0_4_ = 0;
  do {
    sVar2 = std::
            vector<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
            ::size(&script->commands);
    if (sVar2 <= (uint)command) {
      return obj;
    }
    this = std::
           vector<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
           ::operator[](&script->commands,(ulong)(uint)command);
    base = std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>::get(this);
    cmdObj_00 = (char *)(*ctx->chakra->spec->createObject)(ctx->chakra->user_data);
    (*ctx->chakra->spec->push)(value,cmdObj_00,ctx->chakra->user_data);
    write_command_type(ctx,base->type,cmdObj_00);
    switch(base->type) {
    case First:
      pMVar3 = wabt::cast<wabt::ModuleCommand,wabt::Command>(base);
      write_location(ctx,cmdObj_00,&(pMVar3->module).loc);
      uVar4 = std::__cxx11::string::empty((string *)&(pMVar3->module).name);
      if ((uVar4 & 1) == 0) {
        write_string(ctx,cmdObj_00,8,&(pMVar3->module).name);
      }
      write_module(ctx,cmdObj_00,&pMVar3->module,true);
      command._4_4_ = (uint)command;
      break;
    case Action:
      pAVar5 = wabt::cast<wabt::ActionCommandBase<(wabt::CommandType)1>,wabt::Command>(base);
      pAVar18 = std::unique_ptr<wabt::Action,_std::default_delete<wabt::Action>_>::operator->
                          (&pAVar5->action);
      write_location(ctx,cmdObj_00,&pAVar18->loc);
      write_action(ctx,cmdObj_00,&pAVar5->action);
      break;
    case Register:
      pRVar6 = wabt::cast<wabt::RegisterCommand,wabt::Command>(base);
      pcVar7 = cmdObj_00;
      write_location(ctx,cmdObj_00,&(pRVar6->var).loc);
      bVar1 = wabt::Var::is_name(&pRVar6->var);
      if (bVar1) {
        write_var(ctx,cmdObj_00,8,&pRVar6->var);
      }
      else {
        pcVar7 = wabt::Var::index(&pRVar6->var,pcVar7,__c);
        if ((uint)pcVar7 != command._4_4_) {
          __assert_fail("register_command->var.index() == last_module_index",
                        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/chakra/wabtapi.cc"
                        ,0x184,"Js::Var write_commands(Context *, Script *)");
        }
      }
      write_string(ctx,cmdObj_00,0,&pRVar6->module_name);
      break;
    case AssertMalformed:
      pAVar8 = wabt::cast<wabt::AssertModuleCommand<(wabt::CommandType)3>,wabt::Command>(base);
      pSVar12 = std::unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>::get
                          (&pAVar8->module);
      write_invalid_module(ctx,cmdObj_00,pSVar12,&pAVar8->text);
      break;
    case AssertInvalid:
      pAVar9 = wabt::cast<wabt::AssertModuleCommand<(wabt::CommandType)4>,wabt::Command>(base);
      pSVar12 = std::unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>::get
                          (&pAVar9->module);
      write_invalid_module(ctx,cmdObj_00,pSVar12,&pAVar9->text);
      break;
    case AssertUnlinkable:
      pAVar10 = wabt::cast<wabt::AssertModuleCommand<(wabt::CommandType)5>,wabt::Command>(base);
      pSVar12 = std::unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>::get
                          (&pAVar10->module);
      write_invalid_module(ctx,cmdObj_00,pSVar12,&pAVar10->text);
      break;
    case AssertUninstantiable:
      pAVar11 = wabt::cast<wabt::AssertModuleCommand<(wabt::CommandType)6>,wabt::Command>(base);
      pSVar12 = std::unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>::get
                          (&pAVar11->module);
      write_invalid_module(ctx,cmdObj_00,pSVar12,&pAVar11->text);
      break;
    case AssertReturn:
      pAVar13 = wabt::cast<wabt::AssertReturnCommand,wabt::Command>(base);
      pAVar18 = std::unique_ptr<wabt::Action,_std::default_delete<wabt::Action>_>::operator->
                          (&pAVar13->action);
      write_location(ctx,cmdObj_00,&pAVar18->loc);
      write_action(ctx,cmdObj_00,&pAVar13->action);
      write_const_vector(ctx,cmdObj_00,5,&pAVar13->expected);
      break;
    case AssertReturnCanonicalNan:
      pAVar14 = wabt::cast<wabt::ActionCommandBase<(wabt::CommandType)8>,wabt::Command>(base);
      pAVar18 = std::unique_ptr<wabt::Action,_std::default_delete<wabt::Action>_>::operator->
                          (&pAVar14->action);
      write_location(ctx,cmdObj_00,&pAVar18->loc);
      write_action(ctx,cmdObj_00,&pAVar14->action);
      write_action_result_type(ctx,cmdObj_00,5,script,&pAVar14->action);
      break;
    case AssertReturnArithmeticNan:
      pAVar15 = wabt::cast<wabt::ActionCommandBase<(wabt::CommandType)9>,wabt::Command>(base);
      pAVar18 = std::unique_ptr<wabt::Action,_std::default_delete<wabt::Action>_>::operator->
                          (&pAVar15->action);
      write_location(ctx,cmdObj_00,&pAVar18->loc);
      write_action(ctx,cmdObj_00,&pAVar15->action);
      write_action_result_type(ctx,cmdObj_00,5,script,&pAVar15->action);
      break;
    case AssertTrap:
      pAVar16 = wabt::cast<wabt::AssertTrapCommandBase<(wabt::CommandType)10>,wabt::Command>(base);
      pAVar18 = std::unique_ptr<wabt::Action,_std::default_delete<wabt::Action>_>::operator->
                          (&pAVar16->action);
      write_location(ctx,cmdObj_00,&pAVar18->loc);
      write_action(ctx,cmdObj_00,&pAVar16->action);
      write_string(ctx,cmdObj_00,10,&pAVar16->text);
      break;
    case AssertExhaustion:
      pAVar17 = wabt::cast<wabt::AssertTrapCommandBase<(wabt::CommandType)11>,wabt::Command>(base);
      pAVar18 = std::unique_ptr<wabt::Action,_std::default_delete<wabt::Action>_>::operator->
                          (&pAVar17->action);
      write_location(ctx,cmdObj_00,&pAVar18->loc);
      write_action(ctx,cmdObj_00,&pAVar17->action);
    }
    command._0_4_ = (uint)command + 1;
  } while( true );
}

Assistant:

Js::Var write_commands(Context* ctx, Script* script)
{

    Js::Var resultObj = ctx->chakra->spec->createObject(ctx->chakra->user_data);
    Js::Var commandsArr = ctx->chakra->spec->createArray(ctx->chakra->user_data);
    set_property(ctx, resultObj, PropertyIds::commands, commandsArr, "Unable to set commands");
    wabt::Index last_module_index = (wabt::Index) - 1;
    for (wabt::Index i = 0; i < script->commands.size(); ++i)
    {
        const Command* command = script->commands[i].get();

        Js::Var cmdObj = ctx->chakra->spec->createObject(ctx->chakra->user_data);
        ctx->chakra->spec->push(commandsArr, cmdObj, ctx->chakra->user_data);
        write_command_type(ctx, command->type, cmdObj);

        switch (command->type)
        {
        case CommandType::Module:
        {
            const Module& module = cast<ModuleCommand>(command)->module;
            write_location(ctx, cmdObj, &module.loc);
            if (!module.name.empty())
            {
                write_string(ctx, cmdObj, PropertyIds::name, module.name);
            }
            write_module(ctx, cmdObj, &module);
            last_module_index = i;
            break;
        }

        case CommandType::Action:
        {
            const ActionPtr& action = cast<ActionCommand>(command)->action;
            write_location(ctx, cmdObj, &action->loc);
            write_action(ctx, cmdObj, action);
            break;
        }
        case CommandType::Register:
        {
            auto* register_command = cast<RegisterCommand>(command);
            write_location(ctx, cmdObj, &register_command->var.loc);
            if (register_command->var.is_name())
            {
                write_var(ctx, cmdObj, PropertyIds::name, &register_command->var);
            }
            else
            {
                /* If we're not registering by name, then we should only be
                * registering the last module. */
                WABT_USE(last_module_index);
                assert(register_command->var.index() == last_module_index);
            }
            write_string(ctx, cmdObj, PropertyIds::as, register_command->module_name);
            break;
        }
        case CommandType::AssertMalformed:
        {
            auto* assert_malformed_command = cast<AssertMalformedCommand>(command);
            write_invalid_module(ctx, cmdObj, assert_malformed_command->module.get(),
                assert_malformed_command->text);
            break;
        }
        case CommandType::AssertInvalid:
        {
            auto* assert_invalid_command = cast<AssertInvalidCommand>(command);
            write_invalid_module(ctx, cmdObj, assert_invalid_command->module.get(),
                assert_invalid_command->text);
            break;
        }
        case CommandType::AssertUnlinkable:
        {
            auto* assert_unlinkable_command = cast<AssertUnlinkableCommand>(command);
            write_invalid_module(ctx, cmdObj, assert_unlinkable_command->module.get(),
                assert_unlinkable_command->text);
            break;
        }
        case CommandType::AssertUninstantiable:
        {
            auto* assert_uninstantiable_command = cast<AssertUninstantiableCommand>(command);
            write_invalid_module(ctx, cmdObj, assert_uninstantiable_command->module.get(),
                assert_uninstantiable_command->text);
            break;
        }
        case CommandType::AssertReturn:
        {
            auto* assert_return_command = cast<AssertReturnCommand>(command);
            write_location(ctx, cmdObj, &assert_return_command->action->loc);
            write_action(ctx, cmdObj, assert_return_command->action);
            write_const_vector(ctx, cmdObj, PropertyIds::expected, assert_return_command->expected);
            break;
        }
        case CommandType::AssertReturnCanonicalNan:
        {
            auto* assert_return_canonical_nan_command = cast<AssertReturnCanonicalNanCommand>(command);
            write_location(ctx, cmdObj, &assert_return_canonical_nan_command->action->loc);
            write_action(ctx, cmdObj, assert_return_canonical_nan_command->action);
            write_action_result_type(ctx, cmdObj, PropertyIds::expected, script,
                assert_return_canonical_nan_command->action);
            break;
        }
        case CommandType::AssertReturnArithmeticNan:
        {
            auto* assert_return_arithmetic_nan_command = cast<AssertReturnArithmeticNanCommand>(command);
            write_location(ctx, cmdObj, &assert_return_arithmetic_nan_command->action->loc);
            write_action(ctx, cmdObj, assert_return_arithmetic_nan_command->action);
            write_action_result_type(ctx, cmdObj, PropertyIds::expected, script,
                assert_return_arithmetic_nan_command->action);
            break;
        }
        case CommandType::AssertTrap:
        {
            auto* assert_trap_command = cast<AssertTrapCommand>(command);
            write_location(ctx, cmdObj, &assert_trap_command->action->loc);
            write_action(ctx, cmdObj, assert_trap_command->action);
            write_string(ctx, cmdObj, PropertyIds::text, assert_trap_command->text);
            break;
        }
        case CommandType::AssertExhaustion:
        {
            auto* assert_exhaustion_command = cast<AssertExhaustionCommand>(command);
            write_location(ctx, cmdObj, &assert_exhaustion_command->action->loc);
            write_action(ctx, cmdObj, assert_exhaustion_command->action);
            break;
        }
        }
    }
    return resultObj;
}